

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestHugeFieldNumbersLite::clear_oneof_field(TestHugeFieldNumbersLite *this)

{
  TestAllTypesLite *this_00;
  OneofFieldCase OVar1;
  Arena *pAVar2;
  TestHugeFieldNumbersLite *this_local;
  
  OVar1 = oneof_field_case(this);
  if ((OVar1 != ONEOF_FIELD_NOT_SET) && (OVar1 != kOneofUint32)) {
    if (OVar1 == kOneofTestAllTypes) {
      pAVar2 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
      if (pAVar2 == (Arena *)0x0) {
        this_00 = *(TestAllTypesLite **)((long)&this->field_0 + 0x98);
        if (this_00 != (TestAllTypesLite *)0x0) {
          TestAllTypesLite::~TestAllTypesLite(this_00);
          operator_delete(this_00,0x348);
        }
      }
      else if ((this->field_0)._impl_.oneof_field_.oneof_test_all_types_ != (TestAllTypesLite *)0x0)
      {
        TestAllTypesLite::Clear((this->field_0)._impl_.oneof_field_.oneof_test_all_types_);
      }
    }
    else if (OVar1 == kOneofString) {
      google::protobuf::internal::ArenaStringPtr::Destroy
                (&(this->field_0)._impl_.oneof_field_.oneof_string_);
    }
    else if (OVar1 == kOneofBytes) {
      google::protobuf::internal::ArenaStringPtr::Destroy
                (&(this->field_0)._impl_.oneof_field_.oneof_string_);
    }
  }
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void TestHugeFieldNumbersLite::clear_oneof_field() {
// @@protoc_insertion_point(one_of_clear_start:proto2_unittest.TestHugeFieldNumbersLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (oneof_field_case()) {
    case kOneofUint32: {
      // No need to clear
      break;
    }
    case kOneofTestAllTypes: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_test_all_types_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        if (_impl_.oneof_field_.oneof_test_all_types_ != nullptr) {
          _impl_.oneof_field_.oneof_test_all_types_->Clear();
        }
      }
      break;
    }
    case kOneofString: {
      _impl_.oneof_field_.oneof_string_.Destroy();
      break;
    }
    case kOneofBytes: {
      _impl_.oneof_field_.oneof_bytes_.Destroy();
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = ONEOF_FIELD_NOT_SET;
}